

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall pstore::file::file_handle::~file_handle(file_handle *this)

{
  error_or<int> local_28;
  file_handle *local_10;
  file_handle *this_local;
  
  this->is_writable_ = false;
  local_10 = this;
  close_noex(&local_28,this->file_);
  error_or<int>::~error_or(&local_28);
  this->file_ = -1;
  std::__cxx11::string::~string((string *)&this->path_);
  file_base::~file_base(&this->super_file_base);
  return;
}

Assistant:

file_handle::~file_handle () noexcept {
            is_writable_ = false;
            file_handle::close_noex (file_);
            file_ = invalid_oshandle;
        }